

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O3

void dic_delete(dictionary *dic)

{
  int iVar1;
  long lVar2;
  
  iVar1 = dic->length;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (dic->table[lVar2] != (keynode *)0x0) {
        keynode_delete(dic->table[lVar2]);
        iVar1 = dic->length;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  free(dic->table);
  free(dic);
  return;
}

Assistant:

void dic_delete(struct dictionary* dic) {
	for (int i = 0; i < dic->length; i++) {
		if (dic->table[i])
			keynode_delete(dic->table[i]);
	}
	free(dic->table);
	dic->table = 0;
	free(dic);
}